

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cc
# Opt level: O2

void __thiscall muduo::ThreadPool::ThreadPool(ThreadPool *this,string *nameArg)

{
  MutexLock *this_00;
  
  this_00 = &this->mutex_;
  MutexLock::MutexLock(this_00);
  Condition::Condition(&this->notEmpty_,this_00);
  Condition::Condition(&this->notFull_,this_00);
  std::__cxx11::string::string((string *)&this->name_,(string *)nameArg);
  (this->threads_).
  super__Vector_base<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads_).
  super__Vector_base<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->threadInitCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->threadInitCallback_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->threadInitCallback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->threadInitCallback_).super__Function_base._M_functor + 8) = 0;
  (this->threads_).
  super__Vector_base<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>,_std::allocator<std::unique_ptr<muduo::Thread,_std::default_delete<muduo::Thread>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::_Deque_base
            (&(this->queue_).
              super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>);
  this->maxQueueSize_ = 0;
  this->running_ = false;
  return;
}

Assistant:

ThreadPool::ThreadPool(const string& nameArg)
  : mutex_(),
    notEmpty_(mutex_),
    notFull_(mutex_),
    name_(nameArg),
    maxQueueSize_(0),
    running_(false)
{
}